

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall
QWizardPage::registerField
          (QWizardPage *this,QString *name,QWidget *widget,char *property,char *changedSignal)

{
  QWizardPagePrivate *changedSignal_00;
  QObject *in_RCX;
  QString *in_RDX;
  QWizardField *in_RSI;
  QWizardPrivate *in_RDI;
  char *in_R8;
  long in_FS_OFFSET;
  QWizardPagePrivate *d;
  QWizardField field;
  parameter_type in_stack_ffffffffffffff38;
  QWizardPrivate *this_00;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  changedSignal_00 = d_func((QWizardPage *)0x7bd734);
  memset(local_88,0xaa,0x80);
  QWizardField::QWizardField
            ((QWizardField *)this_00,(QWizardPage *)in_RSI,in_RDX,in_RCX,in_R8,
             (char *)changedSignal_00);
  if (changedSignal_00->wizard == (QWizard *)0x0) {
    QList<QWizardField>::operator+=((QList<QWizardField> *)in_RDI,in_stack_ffffffffffffff38);
  }
  else {
    QWizard::d_func((QWizard *)0x7bd790);
    QWizardPrivate::addField(this_00,in_RSI);
  }
  QWizardField::~QWizardField((QWizardField *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::registerField(const QString &name, QWidget *widget, const char *property,
                                const char *changedSignal)
{
    Q_D(QWizardPage);
    QWizardField field(this, name, widget, property, changedSignal);
    if (d->wizard) {
        d->wizard->d_func()->addField(field);
    } else {
        d->pendingFields += field;
    }
}